

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc_normalize.cpp
# Opt level: O3

ScalarFunction * duckdb::NFCNormalizeFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff24;
  FunctionNullHandling in_stack_ffffffffffffff30;
  allocator_type local_c9;
  code *bind_lambda;
  LogicalType local_a8;
  LogicalType local_90;
  vector<duckdb::LogicalType,_true> local_78;
  string local_60;
  LogicalType local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"nfc_normalize","");
  LogicalType::LogicalType(&local_90,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_90;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_78,__l,
             &local_c9);
  LogicalType::LogicalType(&local_a8,VARCHAR);
  bind_lambda = NFCNormalizeFunction;
  LogicalType::LogicalType(&local_40,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_40;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff1c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff24;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_60,&local_78,&local_a8,(scalar_function_t *)&stack0xffffffffffffff38,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_ffffffffffffff30,bind_lambda);
  LogicalType::~LogicalType(&local_40);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff38,(_Any_data *)&stack0xffffffffffffff38,
               __destroy_functor);
  LogicalType::~LogicalType(&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_78);
  LogicalType::~LogicalType(&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

ScalarFunction NFCNormalizeFun::GetFunction() {
	return ScalarFunction("nfc_normalize", {LogicalType::VARCHAR}, LogicalType::VARCHAR, NFCNormalizeFunction);
}